

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O3

int __thiscall deci::ast_unary_t::Generate(ast_unary_t *this,ostream *output,int pc)

{
  int iVar1;
  ostream *poVar2;
  undefined4 in_register_00000014;
  
  iVar1 = (*this->chain->_vptr_ast_item_t[2])(this->chain,output,CONCAT44(in_register_00000014,pc));
  std::__ostream_insert<char,std::char_traits<char>>(output,"unr ",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (output,(this->identifier)._M_dataplus._M_p,(this->identifier)._M_string_length
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return iVar1 + 1;
}

Assistant:

int ast_unary_t::Generate(std::ostream& output, int pc) const {
    pc = this->chain->Generate(output, pc);
    output << "unr " << this->identifier << std::endl;
    return pc + 1;
  }